

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3WriteSegdir(Fts3Table *p,sqlite3_int64 iLevel,int iIdx,sqlite3_int64 iStartBlock,
                   sqlite3_int64 iLeafEndBlock,sqlite3_int64 iEndBlock,sqlite3_int64 nLeafData,
                   char *zRoot,int nRoot)

{
  sqlite3_mutex *psVar1;
  Vdbe *p_00;
  int iVar2;
  int iVar3;
  char *zData;
  Vdbe *p_1;
  long in_FS_OFFSET;
  Vdbe *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (Vdbe *)&DAT_aaaaaaaaaaaaaaaa;
  iVar2 = fts3SqlStmt(p,0xb,(sqlite3_stmt **)&local_40,(sqlite3_value **)0x0);
  p_00 = local_40;
  if (iVar2 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)local_40,1,iLevel);
    sqlite3_bind_int64((sqlite3_stmt *)p_00,2,(long)iIdx);
    sqlite3_bind_int64((sqlite3_stmt *)p_00,3,iStartBlock);
    sqlite3_bind_int64((sqlite3_stmt *)p_00,4,iLeafEndBlock);
    if (nLeafData == 0) {
      sqlite3_bind_int64((sqlite3_stmt *)p_00,5,iEndBlock);
    }
    else {
      zData = sqlite3_mprintf("%lld %lld",iEndBlock);
      if (zData == (char *)0x0) {
        iVar2 = 7;
        goto LAB_001d02ce;
      }
      bindText((sqlite3_stmt *)p_00,5,zData,-1,sqlite3_free,'\x01');
    }
    bindText((sqlite3_stmt *)p_00,6,zRoot,(long)nRoot,(_func_void_void_ptr *)0x0,'\0');
    sqlite3_step((sqlite3_stmt *)p_00);
    iVar2 = sqlite3_reset((sqlite3_stmt *)p_00);
    iVar3 = vdbeUnbind(p_00,5);
    if ((iVar3 == 0) && (psVar1 = p_00->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
  }
LAB_001d02ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3WriteSegdir(
  Fts3Table *p,                   /* Virtual table handle */
  sqlite3_int64 iLevel,           /* Value for "level" field (absolute level) */
  int iIdx,                       /* Value for "idx" field */
  sqlite3_int64 iStartBlock,      /* Value for "start_block" field */
  sqlite3_int64 iLeafEndBlock,    /* Value for "leaves_end_block" field */
  sqlite3_int64 iEndBlock,        /* Value for "end_block" field */
  sqlite3_int64 nLeafData,        /* Bytes of leaf data in segment */
  char *zRoot,                    /* Blob value for "root" field */
  int nRoot                       /* Number of bytes in buffer zRoot */
){
  sqlite3_stmt *pStmt;
  int rc = fts3SqlStmt(p, SQL_INSERT_SEGDIR, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pStmt, 1, iLevel);
    sqlite3_bind_int(pStmt, 2, iIdx);
    sqlite3_bind_int64(pStmt, 3, iStartBlock);
    sqlite3_bind_int64(pStmt, 4, iLeafEndBlock);
    if( nLeafData==0 ){
      sqlite3_bind_int64(pStmt, 5, iEndBlock);
    }else{
      char *zEnd = sqlite3_mprintf("%lld %lld", iEndBlock, nLeafData);
      if( !zEnd ) return SQLITE_NOMEM;
      sqlite3_bind_text(pStmt, 5, zEnd, -1, sqlite3_free);
    }
    sqlite3_bind_blob(pStmt, 6, zRoot, nRoot, SQLITE_STATIC);
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
    sqlite3_bind_null(pStmt, 6);
  }
  return rc;
}